

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::read11F_11F_10F_Channel(GLuint channel,GLubyte *pixel,GLdouble *out_value)

{
  TestError *this;
  double dVar1;
  Float<unsigned_int,_5,_5,_15,_2U> local_44;
  uint local_40;
  Float<unsigned_int,_5,_5,_15,_2U> temp_val_2;
  deUint32 bits_2;
  Float<unsigned_int,_5,_6,_15,_2U> temp_val_1;
  deUint32 bits_1;
  Float<unsigned_int,_5,_6,_15,_2U> temp_val;
  deUint32 bits;
  deUint32 val;
  deUint32 *ptr;
  GLdouble *out_value_local;
  GLubyte *pixel_local;
  GLuint channel_local;
  
  local_40 = *(uint *)pixel;
  if (channel == 0) {
    tcu::Float<unsigned_int,_5,_6,_15,_2U>::Float(&temp_val_1,local_40 & 0x7ff);
    dVar1 = tcu::Float<unsigned_int,_5,_6,_15,_2U>::asDouble(&temp_val_1);
    *out_value = dVar1;
  }
  else if (channel == 1) {
    tcu::Float<unsigned_int,_5,_6,_15,_2U>::Float
              ((Float<unsigned_int,_5,_6,_15,_2U> *)&temp_val_2,local_40 >> 0xb & 0x7ff);
    dVar1 = tcu::Float<unsigned_int,_5,_6,_15,_2U>::asDouble
                      ((Float<unsigned_int,_5,_6,_15,_2U> *)&temp_val_2);
    *out_value = dVar1;
  }
  else {
    if (channel != 2) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid channel",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x7e8);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_40 = local_40 >> 0x16;
    tcu::Float<unsigned_int,_5,_5,_15,_2U>::Float(&local_44,local_40);
    dVar1 = tcu::Float<unsigned_int,_5,_5,_15,_2U>::asDouble(&local_44);
    *out_value = dVar1;
  }
  return;
}

Assistant:

void read11F_11F_10F_Channel(GLuint channel, const GLubyte* pixel, GLdouble& out_value)
{
	const deUint32* ptr = (deUint32*)pixel;
	deUint32		val = *ptr;

	switch (channel)
	{
	case 0:
	{
		deUint32 bits = (val & 0x000007ff);
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> temp_val(bits);

		out_value = temp_val.asDouble();
	}
	break;
	case 1:
	{
		deUint32 bits = ((val >> 11) & 0x000007ff);
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> temp_val(bits);

		out_value = temp_val.asDouble();
	}
	break;
	case 2:
	{
		deUint32 bits = ((val >> 22) & 0x000003ff);
		tcu::Float<deUint32, 5, 5, 15, tcu::FLOAT_SUPPORT_DENORM> temp_val(bits);

		out_value = temp_val.asDouble();
	}
	break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}
}